

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall o3dgc::Arithmetic_Codec::start_decoder(Arithmetic_Codec *this)

{
  Arithmetic_Codec *this_local;
  
  if (this->mode != 0) {
    AC_Error("cannot start decoder");
  }
  if (this->buffer_size == 0) {
    AC_Error("no code buffer set");
  }
  this->mode = 2;
  this->length = 0xffffffff;
  this->ac_pointer = this->code_buffer + 3;
  this->value = (uint)*this->code_buffer << 0x18 | (uint)this->code_buffer[1] << 0x10 |
                (uint)this->code_buffer[2] << 8 | (uint)this->code_buffer[3];
  return;
}

Assistant:

void Arithmetic_Codec::start_decoder(void)
    {
      if (mode != 0) AC_Error("cannot start decoder");
      if (buffer_size == 0) AC_Error("no code buffer set");

                      // initialize decoder: interval, pointer, initial code value
      mode   = 2;
      length = AC__MaxLength;
      ac_pointer = code_buffer + 3;
      value = (unsigned(code_buffer[0]) << 24)|(unsigned(code_buffer[1]) << 16) |
              (unsigned(code_buffer[2]) <<  8)| unsigned(code_buffer[3]);
    }